

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nwkTiming.c
# Opt level: O2

void Nwk_NodeUpdateArrival(Nwk_Obj_t *pObj)

{
  Tim_Man_t *p;
  Vec_Ptr_t *p_00;
  int iVar1;
  int iVar2;
  Nwk_Obj_t *pObj_00;
  Nwk_Obj_t *pObj_01;
  long lVar3;
  int i;
  bool bVar4;
  float fVar5;
  
  if ((*(uint *)&pObj->field_0x20 & 7) != 3) {
    __assert_fail("Nwk_ObjIsNode(pObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/nwk/nwkTiming.c"
                  ,0x23a,"void Nwk_NodeUpdateArrival(Nwk_Obj_t *)");
  }
  p = pObj->pMan->pManTime;
  p_00 = pObj->pMan->vTemp;
  fVar5 = Nwk_NodeComputeArrival(pObj,1);
  if (pObj->tRequired + 0.01 <= fVar5) {
    __assert_fail("Nwk_ManTimeLess( tArrival, Nwk_ObjRequired(pObj), (float)0.01 )",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/nwk/nwkTiming.c"
                  ,0x23d,"void Nwk_NodeUpdateArrival(Nwk_Obj_t *)");
  }
  p_00->nSize = 0;
  Vec_PtrPush(p_00,pObj);
  pObj->field_0x20 = pObj->field_0x20 | 0x10;
  if (p != (Tim_Man_t *)0x0) {
    Tim_ManIncrementTravId(p);
  }
  i = 0;
  pObj_01 = (Nwk_Obj_t *)0x0;
  do {
    if (p_00->nSize <= i) {
      return;
    }
    pObj_00 = (Nwk_Obj_t *)Vec_PtrEntry(p_00,i);
    pObj_00->field_0x20 = pObj_00->field_0x20 & 0xef;
    fVar5 = Nwk_NodeComputeArrival(pObj_00,1);
    if ((p != (Tim_Man_t *)0x0) && ((*(uint *)&pObj_00->field_0x20 & 7) == 1)) {
      fVar5 = Tim_ManGetCiArrival(p,*(uint *)&pObj_00->field_0x20 >> 7);
    }
    if ((fVar5 + 0.01 <= pObj_00->tArrival) || (pObj_00->tArrival + 0.01 <= fVar5)) {
      pObj_00->tArrival = fVar5;
      if ((*(uint *)&pObj_00->field_0x20 & 7) == 2) {
        if (p != (Tim_Man_t *)0x0) {
          iVar1 = Tim_ManBoxForCo(p,*(uint *)&pObj_00->field_0x20 >> 7);
          if (-1 < iVar1) {
            iVar2 = Tim_ManIsCoTravIdCurrent(p,*(uint *)&pObj_00->field_0x20 >> 7);
            if (iVar2 != 0) {
              Tim_ManSetPreviousTravIdBoxInputs(p,iVar1);
            }
            Tim_ManSetCoArrival(p,*(uint *)&pObj_00->field_0x20 >> 7,fVar5);
            Tim_ManSetCurrentTravIdBoxInputs(p,iVar1);
            iVar2 = Tim_ManBoxOutputFirst(p,iVar1);
            iVar1 = Tim_ManBoxOutputNum(p,iVar1);
            if (iVar1 < 1) {
              iVar1 = 0;
            }
            while (bVar4 = iVar1 != 0, iVar1 = iVar1 + -1, bVar4) {
              pObj_01 = Nwk_ManCi(pObj_01->pMan,iVar2);
              if ((pObj_01->field_0x20 & 0x10) == 0) {
                Nwk_NodeUpdateAddToQueue(p_00,pObj_01,i,1);
                pObj_01->field_0x20 = pObj_01->field_0x20 | 0x10;
              }
              iVar2 = iVar2 + 1;
            }
          }
        }
      }
      else {
        for (lVar3 = 0; (int)lVar3 < pObj_00->nFanouts; lVar3 = lVar3 + 1) {
          pObj_01 = pObj_00->pFanio[pObj_00->nFanins + lVar3];
          if (pObj_01 == (Nwk_Obj_t *)0x0) {
            pObj_01 = (Nwk_Obj_t *)0x0;
            break;
          }
          if ((pObj_01->field_0x20 & 0x10) == 0) {
            Nwk_NodeUpdateAddToQueue(p_00,pObj_01,i,1);
            pObj_01->field_0x20 = pObj_01->field_0x20 | 0x10;
          }
        }
      }
    }
    i = i + 1;
  } while( true );
}

Assistant:

void Nwk_NodeUpdateArrival( Nwk_Obj_t * pObj )
{
    Tim_Man_t * pManTime = pObj->pMan->pManTime;
    Vec_Ptr_t * vQueue = pObj->pMan->vTemp;
    Nwk_Obj_t * pTemp;
    Nwk_Obj_t * pNext = NULL; // Suppress "might be used uninitialized"
    float tArrival;
    int iCur, k, iBox, iTerm1, nTerms;
    assert( Nwk_ObjIsNode(pObj) );
    // verify the arrival time
    tArrival = Nwk_NodeComputeArrival( pObj, 1 );
    assert( Nwk_ManTimeLess( tArrival, Nwk_ObjRequired(pObj), (float)0.01 ) );
    // initialize the queue with the node
    Vec_PtrClear( vQueue );
    Vec_PtrPush( vQueue, pObj );
    pObj->MarkA = 1;
    // process objects
    if ( pManTime )
        Tim_ManIncrementTravId( pManTime );
    Vec_PtrForEachEntry( Nwk_Obj_t *, vQueue, pTemp, iCur )
    {
        pTemp->MarkA = 0;
        tArrival = Nwk_NodeComputeArrival( pTemp, 1 );
        if ( Nwk_ObjIsCi(pTemp) && pManTime )
            tArrival = Tim_ManGetCiArrival( pManTime, pTemp->PioId );
        if ( Nwk_ManTimeEqual( tArrival, Nwk_ObjArrival(pTemp), (float)0.01 ) )
            continue;
        Nwk_ObjSetArrival( pTemp, tArrival );
        // add the fanouts to the queue
        if ( Nwk_ObjIsCo(pTemp) )
        {
            if ( pManTime )
            {
                iBox = Tim_ManBoxForCo( pManTime, pTemp->PioId );
                if ( iBox >= 0 ) // this CO is an input of the box
                {
                    // it may happen that a box-input (CO) was already marked as visited
                    // when some other box-input of the same box was visited - here we undo this
                    if ( Tim_ManIsCoTravIdCurrent( pManTime, pTemp->PioId ) )
                        Tim_ManSetPreviousTravIdBoxInputs( pManTime, iBox );
                    Tim_ManSetCoArrival( pManTime, pTemp->PioId, tArrival );
                    Tim_ManSetCurrentTravIdBoxInputs( pManTime, iBox );
                    iTerm1 = Tim_ManBoxOutputFirst( pManTime, iBox );
                    nTerms = Tim_ManBoxOutputNum( pManTime, iBox );
                    for ( k = 0; k < nTerms; k++ )
                    {
                        pNext = Nwk_ManCi(pNext->pMan, iTerm1 + k);
                        if ( pNext->MarkA )
                            continue;
                        Nwk_NodeUpdateAddToQueue( vQueue, pNext, iCur, 1 );
                        pNext->MarkA = 1;
                    }
                }
            }
        }
        else
        {
            Nwk_ObjForEachFanout( pTemp, pNext, k )
            {
                if ( pNext->MarkA )
                    continue;
                Nwk_NodeUpdateAddToQueue( vQueue, pNext, iCur, 1 );
                pNext->MarkA = 1;
            }
        }
    }
}